

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flagser.h
# Opt level: O2

vector<unsigned_short,_std::allocator<unsigned_short>_> *
split<unsigned_short>
          (vector<unsigned_short,_std::allocator<unsigned_short>_> *__return_storage_ptr__,string *s
          ,char delim,
          function<unsigned_short_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
          *transform)

{
  istream *piVar1;
  unsigned_short local_1fa;
  string item;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream ss;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::stringstream::stringstream((stringstream *)&ss,(string *)s,_S_out|_S_in);
  item._M_dataplus._M_p = (pointer)&item.field_2;
  item._M_string_length = 0;
  item.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&ss,(string *)&item,delim);
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
    std::__cxx11::string::string((string *)&local_1d8,(string *)&item);
    local_1fa = std::
                function<unsigned_short_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                ::operator()(transform,&local_1d8);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
              (__return_storage_ptr__,&local_1fa);
    std::__cxx11::string::~string((string *)&local_1d8);
  }
  std::__cxx11::string::~string((string *)&item);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::vector<t> split(const std::string& s, char delim, const std::function<t(std::string)>& transform) {
	std::vector<t> elems;
	std::stringstream ss(s);
	std::string item;
	while (std::getline(ss, item, delim)) elems.push_back(transform(item));
	return elems;
}